

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O3

Expression * __thiscall
wasm::TranslateToFuzzReader::makeStringGet(TranslateToFuzzReader *this,Type type)

{
  Expression *pEVar1;
  Expression *pEVar2;
  Expression *pEVar3;
  
  if (type.id == 2) {
    pEVar1 = makeTrappingRefUse(this,(HeapType)0x50);
    pEVar2 = make(this,(Type)0x2);
    pEVar3 = (Expression *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x20,8);
    pEVar3->_id = StringWTF16GetId;
    (pEVar3->type).id = 0;
    *(Expression **)(pEVar3 + 1) = pEVar1;
    pEVar3[1].type.id = (uintptr_t)pEVar2;
    wasm::StringWTF16Get::finalize();
    return pEVar3;
  }
  __assert_fail("type == Type::i32",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                ,0xeb1,"Expression *wasm::TranslateToFuzzReader::makeStringGet(Type)");
}

Assistant:

Expression* TranslateToFuzzReader::makeStringGet(Type type) {
  assert(type == Type::i32);

  auto* ref = makeTrappingRefUse(HeapType::string);
  auto* pos = make(Type::i32);
  return builder.makeStringWTF16Get(ref, pos);
}